

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isGatherOffsetsResultValid
               (Texture2DArrayView *texture,Sampler *sampler,IntLookupPrecision *prec,Vec3 *coord,
               int componentNdx,IVec2 (*offsets) [4],UVec4 *result)

{
  bool bVar1;
  IVec2 (*offsets_local) [4];
  int componentNdx_local;
  Vec3 *coord_local;
  IntLookupPrecision *prec_local;
  Sampler *sampler_local;
  Texture2DArrayView *texture_local;
  
  bVar1 = is2DArrayGatherOffsetsResultValid<tcu::IntLookupPrecision,unsigned_int>
                    (texture,sampler,prec,coord,componentNdx,offsets,result);
  return bVar1;
}

Assistant:

bool isGatherOffsetsResultValid (const Texture2DArrayView&		texture,
								 const Sampler&					sampler,
								 const IntLookupPrecision&		prec,
								 const Vec3&					coord,
								 int							componentNdx,
								 const IVec2					(&offsets)[4],
								 const UVec4&					result)
{
	return is2DArrayGatherOffsetsResultValid(texture, sampler, prec, coord, componentNdx, offsets, result);
}